

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

int __thiscall Pathie::Path::remove(Path *this,char *__filename)

{
  int iVar1;
  char *__filename_00;
  ErrnoError *this_00;
  int *piVar2;
  undefined1 local_30 [8];
  string nstr;
  Path *this_local;
  
  native_abi_cxx11_((Path *)local_30);
  __filename_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = ::remove(__filename_00);
  if (iVar1 < 0) {
    this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
    piVar2 = __errno_location();
    ErrnoError::ErrnoError(this_00,*piVar2);
    __cxa_throw(this_00,&ErrnoError::typeinfo,ErrnoError::~ErrnoError);
  }
  iVar1 = std::__cxx11::string::~string((string *)local_30);
  return iVar1;
}

Assistant:

void Path::remove() const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();

  if (::remove(nstr.c_str()) < 0)
    throw(Pathie::ErrnoError(errno));
#elif defined(_WIN32)
  std::wstring utf16 = utf8_to_utf16(m_path);
  bool result = false;

  /* On Windows, `_wremove()` doesn’t work on directories. This
   * function uses the apropriate native Win32API function
   * calls accordingly therefore. */
  if (is_directory())
    result = RemoveDirectoryW(utf16.c_str());
  else
    result = DeleteFileW(utf16.c_str());

  if (!result) {
    DWORD err = GetLastError();
    throw(Pathie::WindowsError(err));
  }

#else
#error Unsupported system.
#endif
}